

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O2

string * __thiscall
tinyusdz::fmt::format<std::__cxx11::string>
          (string *__return_storage_ptr__,fmt *this,string *in,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  value_type *sv;
  error_type *__rhs;
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  ostringstream ss;
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [11];
  
  detail::tokenize(&local_1e0,(string *)this);
  if (local_1e0.contained.
      super_storage_t_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == false) {
    ::std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     "(format error: ");
    __rhs = nonstd::expected_lite::
            expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error(&local_1e0);
    ::std::operator+(local_198,&local_1b8,__rhs);
    ::std::operator+(__return_storage_ptr__,local_198,")");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    sv = nonstd::expected_lite::
         expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&local_1e0);
    detail::format_sv<std::__cxx11::string>((ostringstream *)local_198,sv,in);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  nonstd::expected_lite::
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in, Args const &...args) {
  auto ret = detail::tokenize(in);
  if (!ret) {
    return in + "(format error: " + ret.error() + ")";
  }

  std::ostringstream ss;
  detail::format_sv(ss, (*ret), args...);

  return ss.str();
}